

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein.cpp
# Opt level: O1

void duckdb::LevenshteinFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  value_type vVar2;
  value_type vVar3;
  long *plVar4;
  undefined8 *puVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  anon_class_8_1_6971b95b aVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  reference vector;
  reference vector_00;
  long lVar12;
  long lVar13;
  UnifiedVectorFormat *pUVar14;
  long lVar15;
  long lVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  ulong uVar18;
  UnifiedVectorFormat *pUVar19;
  UnifiedVectorFormat *pUVar20;
  ulong uVar21;
  UnifiedVectorFormat *pUVar22;
  VectorType VVar23;
  undefined8 in_R8;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  undefined8 *puVar24;
  ulong uVar25;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffee8;
  undefined8 *local_110;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  unsigned_long local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vVar2 = *vector;
  vVar3 = *vector_00;
  VVar23 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)vVar3 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar23);
    plVar4 = *(long **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      left.value.pointer.ptr = (char *)**(undefined8 **)(vector_00 + 0x20);
      left.value._0_8_ = (*(undefined8 **)(vector + 0x20))[1];
      right.value.pointer.ptr = (char *)in_R8;
      right.value._0_8_ = (*(undefined8 **)(vector_00 + 0x20))[1];
      lVar12 = BinaryLambdaWrapper::
               Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                         ((Vector *)**(undefined8 **)(vector + 0x20),left,right,in_R9,
                          in_stack_fffffffffffffee8);
      *plVar4 = lVar12;
      return;
    }
  }
  else {
    pUVar22 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar3 ^ 2) == 0 && vVar2 == (value_type)0x0) {
      lVar12 = *(long *)(vector + 0x20);
      puVar5 = *(undefined8 **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar23);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar22 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          uVar7 = *puVar5;
          uVar8 = puVar5[1];
          local_110 = (undefined8 *)(lVar12 + 8);
          pUVar20 = (UnifiedVectorFormat *)0x0;
          do {
            left_05.value.pointer.ptr = (char *)uVar7;
            left_05.value._0_8_ = *local_110;
            right_05.value.pointer.ptr = (char *)in_R8;
            right_05.value._0_8_ = uVar8;
            lVar12 = BinaryLambdaWrapper::
                     Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                               ((Vector *)local_110[-1],left_05,right_05,in_R9,
                                in_stack_fffffffffffffee8);
            *(long *)(lVar6 + (long)pUVar20 * 8) = lVar12;
            pUVar20 = pUVar20 + 1;
            local_110 = local_110 + 2;
          } while (pUVar22 != pUVar20);
          return;
        }
        if (pUVar22 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        lVar12 = lVar12 + 8;
        uVar18 = 0;
        pUVar20 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            uVar25 = 0xffffffffffffffff;
          }
          else {
            uVar25 = *(ulong *)(*(long *)(result + 0x28) + uVar18 * 8);
          }
          pUVar14 = pUVar20 + 0x40;
          if (pUVar22 <= pUVar20 + 0x40) {
            pUVar14 = pUVar22;
          }
          pUVar19 = pUVar14;
          if (uVar25 != 0) {
            pUVar19 = pUVar20;
            if (uVar25 == 0xffffffffffffffff) {
              if (pUVar20 < pUVar14) {
                uVar7 = *puVar5;
                uVar8 = puVar5[1];
                puVar24 = (undefined8 *)((long)pUVar20 * 0x10 + lVar12);
                do {
                  left_00.value.pointer.ptr = (char *)uVar7;
                  left_00.value._0_8_ = *puVar24;
                  right_00.value.pointer.ptr = (char *)in_R8;
                  right_00.value._0_8_ = uVar8;
                  lVar13 = BinaryLambdaWrapper::
                           Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                     ((Vector *)puVar24[-1],left_00,right_00,in_R9,
                                      in_stack_fffffffffffffee8);
                  *(long *)(lVar6 + (long)pUVar19 * 8) = lVar13;
                  pUVar19 = pUVar19 + 1;
                  puVar24 = puVar24 + 2;
                } while (pUVar14 != pUVar19);
              }
            }
            else if (pUVar20 < pUVar14) {
              puVar24 = (undefined8 *)((long)pUVar20 * 0x10 + lVar12);
              uVar21 = 0;
              do {
                if ((uVar25 >> (uVar21 & 0x3f) & 1) != 0) {
                  left_01.value.pointer.ptr = (char *)*puVar5;
                  left_01.value._0_8_ = *puVar24;
                  right_01.value.pointer.ptr = (char *)in_R8;
                  right_01.value._0_8_ = puVar5[1];
                  lVar13 = BinaryLambdaWrapper::
                           Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                     ((Vector *)puVar24[-1],left_01,right_01,in_R9,
                                      in_stack_fffffffffffffee8);
                  *(long *)(lVar6 + (long)pUVar20 * 8 + uVar21 * 8) = lVar13;
                }
                uVar21 = uVar21 + 1;
                puVar24 = puVar24 + 2;
              } while (pUVar20 + (uVar21 - (long)pUVar14) != (UnifiedVectorFormat *)0x0);
              pUVar19 = pUVar20 + uVar21;
            }
          }
          uVar18 = uVar18 + 1;
          pUVar20 = pUVar19;
        } while (uVar18 != (ulong)(pUVar22 + 0x3f) >> 6);
        return;
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || vVar3 != (value_type)0x0) {
        if (vVar3 == (value_type)0x0 && vVar2 == (value_type)0x0) {
          lVar12 = *(long *)(vector + 0x20);
          lVar6 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar23);
          lVar13 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            if (pUVar22 != (UnifiedVectorFormat *)0x0) {
              lVar15 = 0;
              do {
                left_10.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + lVar15 * 2);
                left_10.value._0_8_ = *(undefined8 *)(lVar12 + 8 + lVar15 * 2);
                right_10.value.pointer.ptr = (char *)in_R8;
                right_10.value._0_8_ = *(undefined8 *)(lVar6 + 8 + lVar15 * 2);
                lVar16 = BinaryLambdaWrapper::
                         Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(lVar12 + lVar15 * 2),left_10,right_10,in_R9,
                                    in_stack_fffffffffffffee8);
                *(long *)(lVar13 + lVar15) = lVar16;
                lVar15 = lVar15 + 8;
                pUVar22 = pUVar22 + -1;
              } while (pUVar22 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar22 + 0x3f) {
            uVar18 = 0;
            pUVar20 = (UnifiedVectorFormat *)0x0;
            do {
              lVar15 = *(long *)(result + 0x28);
              if (lVar15 == 0) {
                uVar25 = 0xffffffffffffffff;
              }
              else {
                uVar25 = *(ulong *)(lVar15 + uVar18 * 8);
              }
              pUVar14 = pUVar20 + 0x40;
              if (pUVar22 <= pUVar20 + 0x40) {
                pUVar14 = pUVar22;
              }
              pUVar19 = pUVar14;
              if (uVar25 != 0) {
                pUVar19 = pUVar20;
                if (uVar25 == 0xffffffffffffffff) {
                  if (pUVar20 < pUVar14) {
                    lVar15 = (long)pUVar20 * 2 + 1;
                    do {
                      left_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + -8 + lVar15 * 8);
                      left_06.value._0_8_ = *(undefined8 *)(lVar12 + lVar15 * 8);
                      right_06.value.pointer.ptr = (char *)in_R8;
                      right_06.value._0_8_ = *(undefined8 *)(lVar6 + lVar15 * 8);
                      lVar16 = BinaryLambdaWrapper::
                               Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                         (*(Vector **)(lVar12 + -8 + lVar15 * 8),left_06,right_06,
                                          in_R9,in_stack_fffffffffffffee8);
                      *(long *)(lVar13 + (long)pUVar20 * 8) = lVar16;
                      pUVar20 = pUVar20 + 1;
                      lVar15 = lVar15 + 2;
                      pUVar19 = pUVar20;
                    } while (pUVar14 != pUVar20);
                  }
                }
                else if (pUVar20 < pUVar14) {
                  lVar15 = (long)pUVar20 * 2 + 1;
                  uVar21 = 0;
                  do {
                    if ((uVar25 >> (uVar21 & 0x3f) & 1) != 0) {
                      left_07.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + -8 + lVar15 * 8);
                      left_07.value._0_8_ = *(undefined8 *)(lVar12 + lVar15 * 8);
                      right_07.value.pointer.ptr = (char *)in_R8;
                      right_07.value._0_8_ = *(undefined8 *)(lVar6 + lVar15 * 8);
                      lVar16 = BinaryLambdaWrapper::
                               Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                         (*(Vector **)(lVar12 + -8 + lVar15 * 8),left_07,right_07,
                                          in_R9,in_stack_fffffffffffffee8);
                      *(long *)(lVar13 + (long)pUVar20 * 8 + uVar21 * 8) = lVar16;
                    }
                    uVar21 = uVar21 + 1;
                    lVar15 = lVar15 + 2;
                  } while (pUVar20 + (uVar21 - (long)pUVar14) != (UnifiedVectorFormat *)0x0);
                  pUVar19 = pUVar20 + uVar21;
                }
              }
              uVar18 = uVar18 + 1;
              pUVar20 = pUVar19;
            } while (uVar18 != (ulong)(pUVar22 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar22);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar22);
          duckdb::Vector::SetVectorType(VVar23);
          lVar12 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            if (pUVar22 != (UnifiedVectorFormat *)0x0) {
              lVar6 = *local_78;
              lVar13 = *local_c0;
              pUVar20 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar14 = pUVar20;
                if (lVar6 != 0) {
                  pUVar14 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar20 * 4);
                }
                pUVar19 = pUVar20;
                if (lVar13 != 0) {
                  pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar13 + (long)pUVar20 * 4);
                }
                left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar19 * 0x10)
                ;
                left_02.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar14 * 0x10);
                right_02.value.pointer.ptr = (char *)in_R8;
                right_02.value._0_8_ = *(undefined8 *)(local_b8 + 8 + (long)pUVar19 * 0x10);
                lVar15 = BinaryLambdaWrapper::
                         Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(local_70 + (long)pUVar14 * 0x10),left_02,right_02,
                                    in_R9,in_stack_fffffffffffffee8);
                *(long *)(lVar12 + (long)pUVar20 * 8) = lVar15;
                pUVar20 = pUVar20 + 1;
              } while (pUVar22 != pUVar20);
            }
          }
          else if (pUVar22 != (UnifiedVectorFormat *)0x0) {
            lVar6 = *local_78;
            lVar13 = *local_c0;
            pUVar20 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar14 = pUVar20;
              if (lVar6 != 0) {
                pUVar14 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar20 * 4);
              }
              pUVar19 = pUVar20;
              if (lVar13 != 0) {
                pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar13 + (long)pUVar20 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar14 >> 6) * 8) >> ((ulong)pUVar14 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar19 >> 6) * 8) >> ((ulong)pUVar19 & 0x3f) & 1)
                   != 0)))) {
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar19 * 0x10)
                ;
                left_08.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar14 * 0x10);
                right_08.value.pointer.ptr = (char *)in_R8;
                right_08.value._0_8_ = *(undefined8 *)(local_b8 + 8 + (long)pUVar19 * 0x10);
                lVar15 = BinaryLambdaWrapper::
                         Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(local_70 + (long)pUVar14 * 0x10),left_08,right_08,
                                    in_R9,in_stack_fffffffffffffee8);
                *(long *)(lVar12 + (long)pUVar20 * 8) = lVar15;
              }
              else {
                if (*(long *)(result + 0x28) == 0) {
                  local_c8 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var11 = p_Stack_d0;
                  uVar7 = local_d8;
                  local_d8 = 0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(undefined8 *)(result + 0x30) = uVar7;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var11;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  *(unsigned_long **)(result + 0x28) =
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                }
                bVar10 = (byte)pUVar20 & 0x3f;
                puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar20 >> 6) * 8);
                *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              }
              pUVar20 = pUVar20 + 1;
            } while (pUVar22 != pUVar20);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        return;
      }
      puVar5 = *(undefined8 **)(vector + 0x20);
      lVar12 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar23);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar22 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          aVar9.result = (Vector *)*puVar5;
          uVar7 = puVar5[1];
          local_110 = (undefined8 *)(lVar12 + 8);
          pUVar20 = (UnifiedVectorFormat *)0x0;
          do {
            left_09.value.pointer.ptr = (char *)local_110[-1];
            left_09.value._0_8_ = uVar7;
            right_09.value.pointer.ptr = (char *)in_R8;
            right_09.value._0_8_ = *local_110;
            lVar12 = BinaryLambdaWrapper::
                     Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                               (aVar9,left_09,right_09,in_R9,in_stack_fffffffffffffee8);
            *(long *)(lVar6 + (long)pUVar20 * 8) = lVar12;
            pUVar20 = pUVar20 + 1;
            local_110 = local_110 + 2;
          } while (pUVar22 != pUVar20);
          return;
        }
        if (pUVar22 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        lVar12 = lVar12 + 8;
        uVar18 = 0;
        pUVar20 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            uVar25 = 0xffffffffffffffff;
          }
          else {
            uVar25 = *(ulong *)(*(long *)(result + 0x28) + uVar18 * 8);
          }
          pUVar14 = pUVar20 + 0x40;
          if (pUVar22 <= pUVar20 + 0x40) {
            pUVar14 = pUVar22;
          }
          pUVar19 = pUVar14;
          if (uVar25 != 0) {
            pUVar19 = pUVar20;
            if (uVar25 == 0xffffffffffffffff) {
              if (pUVar20 < pUVar14) {
                aVar9.result = (Vector *)*puVar5;
                uVar7 = puVar5[1];
                puVar24 = (undefined8 *)((long)pUVar20 * 0x10 + lVar12);
                do {
                  left_03.value.pointer.ptr = (char *)puVar24[-1];
                  left_03.value._0_8_ = uVar7;
                  right_03.value.pointer.ptr = (char *)in_R8;
                  right_03.value._0_8_ = *puVar24;
                  lVar13 = BinaryLambdaWrapper::
                           Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                     (aVar9,left_03,right_03,in_R9,in_stack_fffffffffffffee8);
                  *(long *)(lVar6 + (long)pUVar20 * 8) = lVar13;
                  pUVar20 = pUVar20 + 1;
                  puVar24 = puVar24 + 2;
                  pUVar19 = pUVar20;
                } while (pUVar14 != pUVar20);
              }
            }
            else if (pUVar20 < pUVar14) {
              puVar24 = (undefined8 *)((long)pUVar20 * 0x10 + lVar12);
              uVar21 = 0;
              do {
                if ((uVar25 >> (uVar21 & 0x3f) & 1) != 0) {
                  left_04.value.pointer.ptr = (char *)puVar24[-1];
                  left_04.value._0_8_ = puVar5[1];
                  right_04.value.pointer.ptr = (char *)in_R8;
                  right_04.value._0_8_ = *puVar24;
                  lVar13 = BinaryLambdaWrapper::
                           Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                     ((Vector *)*puVar5,left_04,right_04,in_R9,
                                      in_stack_fffffffffffffee8);
                  *(long *)((long)pUVar20 * 8 + lVar6 + uVar21 * 8) = lVar13;
                }
                uVar21 = uVar21 + 1;
                puVar24 = puVar24 + 2;
              } while (pUVar20 + (uVar21 - (long)pUVar14) != (UnifiedVectorFormat *)0x0);
              pUVar19 = pUVar20 + uVar21;
            }
          }
          uVar18 = uVar18 + 1;
          pUVar20 = pUVar19;
        } while (uVar18 != (ulong)(pUVar22 + 0x3f) >> 6);
        return;
      }
    }
    duckdb::Vector::SetVectorType(VVar23);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void LevenshteinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &tgt_vec = args.data[1];

	BinaryExecutor::Execute<string_t, string_t, int64_t>(
	    str_vec, tgt_vec, result, args.size(),
	    [&](string_t str, string_t tgt) { return LevenshteinScalarFunction(result, str, tgt); });
}